

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg.cpp
# Opt level: O0

void __thiscall
cfgfile::generator::cfg::tag_base_class_t::tag_base_class_t
          (tag_base_class_t *this,tag_t<cfgfile::string_trait_t> *owner,string *name,
          bool is_mandatory)

{
  tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
  *in_RDI;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  constraint_one_of_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff90;
  tag_t<cfgfile::string_trait_t> *in_stack_ffffffffffffff98;
  tag_t<cfgfile::string_trait_t> *owner_00;
  tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
  *in_stack_ffffffffffffffa0;
  tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
  *this_00;
  tag_min_max_constraint_t *this_01;
  
  tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
  ::tag_scalar_t(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                 (string_t *)in_stack_ffffffffffffff90,(bool)in_stack_ffffffffffffff8f);
  (in_RDI->super_tag_t<cfgfile::string_trait_t>)._vptr_tag_t =
       (_func_int **)&PTR__tag_base_class_t_00187f68;
  tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
  ::tag_scalar_t(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                 (string_t *)in_stack_ffffffffffffff90,(bool)in_stack_ffffffffffffff8f);
  constraint_one_of_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::constraint_one_of_t(in_stack_ffffffffffffff90);
  this_01 = (tag_min_max_constraint_t *)
            &in_RDI[2].super_tag_t<cfgfile::string_trait_t>.m_child_tags.
             super__Vector_base<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
  ::tag_scalar_t(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                 (string_t *)in_stack_ffffffffffffff90,(bool)in_stack_ffffffffffffff8f);
  tag_min_max_constraint_t::tag_min_max_constraint_t
            (this_01,(tag_t<cfgfile::string_trait_t> *)
                     &in_RDI[3].super_tag_t<cfgfile::string_trait_t>.m_child_tags.
                      super__Vector_base<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
  this_00 = (tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
             *)&in_RDI[6].super_tag_t<cfgfile::string_trait_t>.field_0x10;
  tag_one_of_constraint_t::tag_one_of_constraint_t
            ((tag_one_of_constraint_t *)in_stack_ffffffffffffff90,
             (tag_t<cfgfile::string_trait_t> *)
             CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
  owner_00 = (tag_t<cfgfile::string_trait_t> *)
             &in_RDI[7].super_tag_t<cfgfile::string_trait_t>.m_name;
  tag_no_value_t<cfgfile::string_trait_t>::tag_no_value_t
            ((tag_no_value_t<cfgfile::string_trait_t> *)this_00,owner_00,
             (string_t *)in_stack_ffffffffffffff90,(bool)in_stack_ffffffffffffff8f);
  tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
  ::tag_scalar_t(this_00,owner_00,(string_t *)&in_RDI[7].field_0x68,(bool)in_stack_ffffffffffffff8f)
  ;
  constraint_one_of_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::add_value((constraint_one_of_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)this_00,
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)owner_00);
  constraint_one_of_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::add_value((constraint_one_of_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)this_00,
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)owner_00);
  constraint_one_of_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::add_value((constraint_one_of_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)this_00,
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)owner_00);
  tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
  ::set_constraint(in_RDI,(constraint_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)(in_RDI + 2));
  return;
}

Assistant:

tag_base_class_t::tag_base_class_t(
	cfgfile::tag_t< cfgfile::string_trait_t > & owner,
	const std::string & name, bool is_mandatory )
	:	cfgfile::tag_scalar_t< std::string > ( owner, name, is_mandatory )
	,	m_value_type( *this, c_value_type_tag_name, false )
	,	m_name( *this, c_field_name_tag_name, false )
	,	m_min_max_constraint( *this )
	,	m_one_of_constraint( *this )
	,	m_is_required( *this, c_required_tag_name, false )
	,	m_default_value( *this, c_default_value_tag_name, false )
{
	m_constraint.add_value( c_scalar_tag_name );
	m_constraint.add_value( c_no_value_tag_name );
	m_constraint.add_value( c_scalar_vector_tag_name );

	set_constraint( &m_constraint );
}